

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void add_zero_pad(double *X,int rows,int cols,int zrow,int zcol,double *Y)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar4 = zcol + cols;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < cols) {
    uVar6 = (ulong)(uint)cols;
  }
  uVar8 = 0;
  if (0 < rows) {
    uVar8 = (ulong)(uint)rows;
  }
  lVar1 = (long)(int)uVar4;
  pdVar2 = Y;
  for (; uVar5 != uVar8; uVar5 = uVar5 + 1) {
    for (uVar7 = 0; lVar3 = (long)cols, uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pdVar2[uVar7] = X[uVar7];
    }
    for (; lVar3 < lVar1; lVar3 = lVar3 + 1) {
      pdVar2[lVar3] = 0.0;
    }
    pdVar2 = pdVar2 + lVar1;
    X = X + cols;
  }
  uVar5 = 0;
  if (0 < (int)uVar4) {
    uVar5 = (ulong)uVar4;
  }
  lVar3 = (long)rows;
  pdVar2 = Y + lVar1 * lVar3;
  for (; lVar3 < zrow + rows; lVar3 = lVar3 + 1) {
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      pdVar2[uVar6] = 0.0;
    }
    pdVar2 = pdVar2 + lVar1;
  }
  return;
}

Assistant:

void add_zero_pad(double *X, int rows, int cols, int zrow, int zcol,double *Y) {
	int r,c,i,j,u,v;
	r = rows + zrow;
	c = cols + zcol;
	
	for (i = 0; i < rows;++i) {
		u = i*c;
		v = i * cols;
		for (j = 0; j < cols;++j) {
			Y[u + j] = X[v + j];
		}
		for (j = cols; j < c;++j) {
			Y[u + j] = 0.;
		}
	}
	
	for (i = rows; i < r;++i) {
		u = i*c;
		for(j = 0; j < c;++j) {
			Y[u + j] = 0.;
		}
	}
	
}